

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-bitflag.c
# Opt level: O2

_Bool flags_clear(bitflag *flags,size_t size,...)

{
  int *piVar1;
  char in_AL;
  _Bool _Var2;
  undefined8 in_RCX;
  int *piVar3;
  undefined8 in_RDX;
  ulong uVar4;
  ulong uVar5;
  undefined8 in_R8;
  int *piVar6;
  undefined8 in_R9;
  ulong uVar7;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  int local_c8 [4];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  uVar4 = 0x18;
  _Var2 = false;
  piVar1 = (int *)&stack0x00000008;
  piVar6 = (int *)&local_b8;
  do {
    piVar3 = piVar1;
    uVar4 = uVar4 & 0xffffffff;
    while( true ) {
      if ((long)*piVar6 == 0) {
        return _Var2;
      }
      uVar5 = (long)*piVar6 - 1;
      uVar7 = uVar5 >> 3;
      if (size <= uVar7) {
        local_b8 = in_RDX;
        local_b0 = in_RCX;
        local_a8 = in_R8;
        local_a0 = in_R9;
        __assert_fail("flag_offset < size",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-bitflag.c"
                      ,0x1db,"_Bool flags_clear(bitflag *, const size_t, ...)");
      }
      _Var2 = (_Bool)(_Var2 | (flags[uVar7] >> ((uint)uVar5 & 7) & 1) != 0);
      flags[uVar7] = ~(byte)(1 << ((byte)uVar5 & 7)) & flags[uVar7];
      if (0x28 < (uint)uVar4) break;
      piVar6 = (int *)((long)local_c8 + uVar4);
      uVar4 = uVar4 + 8;
    }
    piVar1 = piVar3 + 2;
    piVar6 = piVar3;
  } while( true );
}

Assistant:

bool flags_clear(bitflag *flags, const size_t size, ...)
{
	size_t flag_offset;
	int flag_binary;
	int f;
	va_list args;
	bool delta = false;

	va_start(args, size);

	/* Process each flag in the va-args */
	for (f = va_arg(args, int); f != FLAG_END; f = va_arg(args, int)) {
		flag_offset = FLAG_OFFSET(f);
		flag_binary = FLAG_BINARY(f);

		assert(flag_offset < size);

		/* flag_has() */
		if (flags[flag_offset] & flag_binary) delta = true;

		/* flag_off() */
		flags[flag_offset] &= ~flag_binary;
	}

	va_end(args);

	return delta;
}